

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureBarrierSameTexelRWBase::updateTextureData(TextureBarrierSameTexelRWBase *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  GLuint i;
  long lVar4;
  GLuint *pGVar5;
  
  if ((this->super_TextureBarrierBasicOutline).m_width != 0) {
    uVar2 = 0;
    do {
      if ((this->super_TextureBarrierBasicOutline).m_height != 0) {
        uVar3 = 0;
        do {
          lVar4 = 0;
          do {
            if (((((int)uVar2 < 0) || ((int)uVar3 < 0)) ||
                (uVar1 = (this->super_TextureBarrierBasicOutline).m_width, uVar1 <= uVar2)) ||
               ((this->super_TextureBarrierBasicOutline).m_height <= uVar3)) {
              TextureBarrierBasicOutline::texel(unsigned_int*,unsigned_int,unsigned_int)::zero = 0;
              pGVar5 = &TextureBarrierBasicOutline::texel(unsigned_int*,unsigned_int,unsigned_int)::
                        zero;
            }
            else {
              pGVar5 = (this->super_TextureBarrierBasicOutline).m_reference[lVar4] +
                       (uVar1 * uVar3 + uVar2);
            }
            *pGVar5 = *pGVar5 + 1;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
          uVar3 = uVar3 + 1;
        } while (uVar3 < (this->super_TextureBarrierBasicOutline).m_height);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->super_TextureBarrierBasicOutline).m_width);
  }
  return;
}

Assistant:

virtual void updateTextureData()
	{
		for (GLuint x = 0; x < m_width; ++x)
			for (GLuint y = 0; y < m_height; ++y)
			{
				for (GLuint i = 0; i < NUM_TEXTURES; ++i)
				{
					texel(m_reference[i], x, y)++;
				}
			}
	}